

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O2

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendFragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  length_t termLength;
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  ulong uVar4;
  long lVar5;
  long v;
  uint uVar6;
  index_t remaining;
  index_t iVar7;
  byte flags;
  int iVar8;
  index_t length_00;
  
  uVar6 = 0;
  if (0 < length % maxPayloadLength) {
    uVar6 = length % maxPayloadLength + 0x3fU & 0xffffffe0;
  }
  iVar8 = (maxPayloadLength + 0x20) * (length / maxPayloadLength) + uVar6;
  uVar4 = getAndAddRawTail(this,iVar8);
  termLength = this->m_termBuffer->m_length;
  iVar3 = (int32_t)(uVar4 >> 0x20);
  checkTerm(activeTermId,iVar3);
  lVar5 = (long)iVar8 + (uVar4 & 0xffffffff);
  if ((int)termLength < lVar5) {
    iVar3 = handleEndOfLogCondition(this->m_termBuffer,uVar4 & 0xffffffff,header,termLength,iVar3);
    return iVar3;
  }
  bVar2 = 0x80;
  iVar7 = length;
  do {
    length_00 = maxPayloadLength;
    if (iVar7 < maxPayloadLength) {
      length_00 = iVar7;
    }
    flags = bVar2 | 0x40;
    if (maxPayloadLength < iVar7) {
      flags = bVar2;
    }
    uVar6 = length_00 + 0x20;
    iVar8 = (int)uVar4;
    HeaderWriter::write(header,(int)this->m_termBuffer,(void *)(uVar4 & 0xffffffff),(ulong)uVar6);
    AtomicBuffer::putBytes
              (this->m_termBuffer,iVar8 + 0x20,srcBuffer,(srcOffset + length) - iVar7,length_00);
    FrameDescriptor::frameFlags(this->m_termBuffer,iVar8,flags);
    v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                  (reservedValueSupplier,this->m_termBuffer,iVar8,uVar6);
    AtomicBuffer::putInt64(this->m_termBuffer,iVar8 + 0x18,v);
    AtomicBuffer::putInt32Ordered(this->m_termBuffer,iVar8,uVar6);
    bVar2 = 0;
    uVar4 = (ulong)((length_00 + 0x3fU & 0xffffffe0) + iVar8);
    iVar8 = iVar7 - length_00;
    bVar1 = length_00 <= iVar7;
    iVar7 = iVar8;
  } while (iVar8 != 0 && bVar1);
  return (int32_t)lVar5;
}

Assistant:

std::int32_t appendFragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;
        const std::int64_t rawTail = getAndAddRawTail(requiredLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + requiredLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength =
                    util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, frameOffset, frameLength, termId);
                m_termBuffer.putBytes(
                    frameOffset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, frameOffset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
                m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);

                flags = 0;
                frameOffset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }